

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O0

void ImVector_ImFontConfig_resize(ImVector_ImFontConfig *self,int new_size)

{
  int new_size_local;
  ImVector_ImFontConfig *self_local;
  
  ImVector<ImFontConfig>::resize(self,new_size);
  return;
}

Assistant:

CIMGUI_API void ImVector_ImFontConfig_resize(ImVector_ImFontConfig* self,int new_size)
{
    return self->resize(new_size);
}